

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

uint256 * anon_unknown.dwarf_18a6e62::GetPrevoutsSHA256<CMutableTransaction>
                    (uint256 *__return_storage_ptr__,CMutableTransaction *txTo)

{
  pointer pCVar1;
  base_blob<256U> *pbVar2;
  CTxIn *txin;
  pointer data;
  long in_FS_OFFSET;
  HashWriter ss;
  uint32_t local_9c;
  CSHA256 local_98;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_98.buf[0x30] = '\0';
  local_98.buf[0x31] = '\0';
  local_98.buf[0x32] = '\0';
  local_98.buf[0x33] = '\0';
  local_98.buf[0x34] = '\0';
  local_98.buf[0x35] = '\0';
  local_98.buf[0x36] = '\0';
  local_98.buf[0x37] = '\0';
  local_98.buf[0x38] = '\0';
  local_98.buf[0x39] = '\0';
  local_98.buf[0x3a] = '\0';
  local_98.buf[0x3b] = '\0';
  local_98.buf[0x3c] = '\0';
  local_98.buf[0x3d] = '\0';
  local_98.buf[0x3e] = '\0';
  local_98.buf[0x3f] = '\0';
  local_98.buf[0x20] = '\0';
  local_98.buf[0x21] = '\0';
  local_98.buf[0x22] = '\0';
  local_98.buf[0x23] = '\0';
  local_98.buf[0x24] = '\0';
  local_98.buf[0x25] = '\0';
  local_98.buf[0x26] = '\0';
  local_98.buf[0x27] = '\0';
  local_98.buf[0x28] = '\0';
  local_98.buf[0x29] = '\0';
  local_98.buf[0x2a] = '\0';
  local_98.buf[0x2b] = '\0';
  local_98.buf[0x2c] = '\0';
  local_98.buf[0x2d] = '\0';
  local_98.buf[0x2e] = '\0';
  local_98.buf[0x2f] = '\0';
  local_98.buf[0x10] = '\0';
  local_98.buf[0x11] = '\0';
  local_98.buf[0x12] = '\0';
  local_98.buf[0x13] = '\0';
  local_98.buf[0x14] = '\0';
  local_98.buf[0x15] = '\0';
  local_98.buf[0x16] = '\0';
  local_98.buf[0x17] = '\0';
  local_98.buf[0x18] = '\0';
  local_98.buf[0x19] = '\0';
  local_98.buf[0x1a] = '\0';
  local_98.buf[0x1b] = '\0';
  local_98.buf[0x1c] = '\0';
  local_98.buf[0x1d] = '\0';
  local_98.buf[0x1e] = '\0';
  local_98.buf[0x1f] = '\0';
  local_98.buf[0] = '\0';
  local_98.buf[1] = '\0';
  local_98.buf[2] = '\0';
  local_98.buf[3] = '\0';
  local_98.buf[4] = '\0';
  local_98.buf[5] = '\0';
  local_98.buf[6] = '\0';
  local_98.buf[7] = '\0';
  local_98.buf[8] = '\0';
  local_98.buf[9] = '\0';
  local_98.buf[10] = '\0';
  local_98.buf[0xb] = '\0';
  local_98.buf[0xc] = '\0';
  local_98.buf[0xd] = '\0';
  local_98.buf[0xe] = '\0';
  local_98.buf[0xf] = '\0';
  local_98.s[4] = 0;
  local_98.s[5] = 0;
  local_98.s[6] = 0;
  local_98.s[7] = 0;
  local_98.s[0] = 0;
  local_98.s[1] = 0;
  local_98.s[2] = 0;
  local_98.s[3] = 0;
  local_98.bytes = 0;
  CSHA256::CSHA256(&local_98);
  data = (txTo->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
         super__Vector_impl_data._M_start;
  pCVar1 = (txTo->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (data != pCVar1) {
    do {
      CSHA256::Write(&local_98,(uchar *)data,0x20);
      local_9c = (data->prevout).n;
      CSHA256::Write(&local_98,(uchar *)&local_9c,4);
      data = data + 1;
    } while (data != pCVar1);
  }
  pbVar2 = &__return_storage_ptr__->super_base_blob<256U>;
  (pbVar2->m_data)._M_elems[0x10] = '\0';
  (pbVar2->m_data)._M_elems[0x11] = '\0';
  (pbVar2->m_data)._M_elems[0x12] = '\0';
  (pbVar2->m_data)._M_elems[0x13] = '\0';
  (pbVar2->m_data)._M_elems[0x14] = '\0';
  (pbVar2->m_data)._M_elems[0x15] = '\0';
  (pbVar2->m_data)._M_elems[0x16] = '\0';
  (pbVar2->m_data)._M_elems[0x17] = '\0';
  pbVar2 = &__return_storage_ptr__->super_base_blob<256U>;
  (pbVar2->m_data)._M_elems[0x18] = '\0';
  (pbVar2->m_data)._M_elems[0x19] = '\0';
  (pbVar2->m_data)._M_elems[0x1a] = '\0';
  (pbVar2->m_data)._M_elems[0x1b] = '\0';
  (pbVar2->m_data)._M_elems[0x1c] = '\0';
  (pbVar2->m_data)._M_elems[0x1d] = '\0';
  (pbVar2->m_data)._M_elems[0x1e] = '\0';
  (pbVar2->m_data)._M_elems[0x1f] = '\0';
  (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[0] = '\0';
  (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[1] = '\0';
  (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[2] = '\0';
  (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[3] = '\0';
  (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[4] = '\0';
  (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[5] = '\0';
  (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[6] = '\0';
  (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[7] = '\0';
  pbVar2 = &__return_storage_ptr__->super_base_blob<256U>;
  (pbVar2->m_data)._M_elems[8] = '\0';
  (pbVar2->m_data)._M_elems[9] = '\0';
  (pbVar2->m_data)._M_elems[10] = '\0';
  (pbVar2->m_data)._M_elems[0xb] = '\0';
  (pbVar2->m_data)._M_elems[0xc] = '\0';
  (pbVar2->m_data)._M_elems[0xd] = '\0';
  (pbVar2->m_data)._M_elems[0xe] = '\0';
  (pbVar2->m_data)._M_elems[0xf] = '\0';
  CSHA256::Finalize(&local_98,(uchar *)__return_storage_ptr__);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

uint256 GetPrevoutsSHA256(const T& txTo)
{
    HashWriter ss{};
    for (const auto& txin : txTo.vin) {
        ss << txin.prevout;
    }
    return ss.GetSHA256();
}